

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O2

bool __thiscall
Parameter<std::vector<double,_std::allocator<double>_>_>::internalSetData<unsigned_long>
          (Parameter<std::vector<double,_std::allocator<double>_>_> *this,unsigned_long data)

{
  _Vector_base<double,_std::allocator<double>_> local_18;
  
  local_18._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_18._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_18);
  return false;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }